

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void mbedtls_aes_decrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint *puVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  
  puVar13 = ctx->rk;
  uVar14 = *puVar13 ^ *(uint *)input;
  uVar17 = puVar13[1] ^ *(uint *)(input + 4);
  uVar18 = puVar13[2] ^ *(uint *)(input + 8);
  uVar22 = puVar13[3] ^ *(uint *)(input + 0xc);
  puVar13 = puVar13 + 0xb;
  for (iVar15 = ctx->nr >> 1; 1 < iVar15; iVar15 = iVar15 + -1) {
    uVar19 = RT0[uVar14 & 0xff] ^ puVar13[-7] ^ RT1[uVar22 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar18 >> 0xe & 0x3fc)) ^ RT3[uVar17 >> 0x18];
    uVar20 = RT0[uVar17 & 0xff] ^ puVar13[-6] ^ RT1[uVar14 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar22 >> 0xe & 0x3fc)) ^ RT3[uVar18 >> 0x18];
    uVar16 = RT0[uVar18 & 0xff] ^ puVar13[-5] ^ RT1[uVar17 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar14 >> 0xe & 0x3fc)) ^ RT3[uVar22 >> 0x18];
    uVar22 = RT0[uVar22 & 0xff] ^ puVar13[-4] ^ RT1[uVar18 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar17 >> 0xe & 0x3fc)) ^ RT3[uVar14 >> 0x18];
    uVar14 = RT0[uVar19 & 0xff] ^ puVar13[-3] ^ RT1[uVar22 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^ RT3[uVar20 >> 0x18];
    uVar17 = RT0[uVar20 & 0xff] ^ puVar13[-2] ^ RT1[uVar19 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar22 >> 0xe & 0x3fc)) ^ RT3[uVar16 >> 0x18];
    uVar18 = RT0[uVar16 & 0xff] ^ puVar13[-1] ^ RT1[uVar20 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ RT3[uVar22 >> 0x18];
    uVar22 = RT0[uVar22 & 0xff] ^ *puVar13 ^ RT1[uVar16 >> 8 & 0xff] ^
             *(uint *)((long)RT2 + (ulong)(uVar20 >> 0xe & 0x3fc)) ^ RT3[uVar19 >> 0x18];
    puVar13 = puVar13 + 8;
  }
  uVar21 = RT0[uVar14 & 0xff] ^ puVar13[-7] ^ RT1[uVar22 >> 8 & 0xff] ^
           *(uint *)((long)RT2 + (ulong)(uVar18 >> 0xe & 0x3fc)) ^ RT3[uVar17 >> 0x18];
  uVar16 = RT0[uVar17 & 0xff] ^ puVar13[-6] ^ RT1[uVar14 >> 8 & 0xff] ^
           *(uint *)((long)RT2 + (ulong)(uVar22 >> 0xe & 0x3fc)) ^ RT3[uVar18 >> 0x18];
  uVar20 = RT0[uVar18 & 0xff] ^ puVar13[-5] ^ RT1[uVar17 >> 8 & 0xff] ^
           *(uint *)((long)RT2 + (ulong)(uVar14 >> 0xe & 0x3fc)) ^ RT3[uVar22 >> 0x18];
  uVar19 = RT0[uVar22 & 0xff] ^ puVar13[-4] ^ RT1[uVar18 >> 8 & 0xff] ^
           *(uint *)((long)RT2 + (ulong)(uVar17 >> 0xe & 0x3fc)) ^ RT3[uVar14 >> 0x18];
  bVar1 = RSb[uVar16 & 0xff];
  uVar14 = puVar13[-2];
  bVar2 = RSb[uVar20 & 0xff];
  uVar17 = puVar13[-1];
  bVar3 = RSb[uVar19 & 0xff];
  uVar18 = *puVar13;
  uVar22 = ((uint)RSb[uVar16 >> 0x18] << 0x18 |
           (uint)RSb[uVar20 >> 0x10 & 0xff] << 0x10 | (uint)RSb[uVar19 >> 8 & 0xff] << 8) ^
           (uint)RSb[uVar21 & 0xff] ^ puVar13[-3];
  bVar4 = RSb[uVar21 >> 8 & 0xff];
  bVar5 = RSb[uVar19 >> 0x10 & 0xff];
  bVar6 = RSb[uVar20 >> 0x18];
  bVar7 = RSb[uVar16 >> 8 & 0xff];
  bVar8 = RSb[uVar21 >> 0x10 & 0xff];
  bVar9 = RSb[uVar19 >> 0x18];
  bVar10 = RSb[uVar20 >> 8 & 0xff];
  bVar11 = RSb[uVar16 >> 0x10 & 0xff];
  bVar12 = RSb[uVar21 >> 0x18];
  *output = (uchar)((uint)RSb[uVar21 & 0xff] ^ puVar13[-3]);
  output[1] = (uchar)(uVar22 >> 8);
  output[2] = (uchar)(uVar22 >> 0x10);
  output[3] = (uchar)(uVar22 >> 0x18);
  uVar22 = ((uint)bVar6 << 0x18 | (uint)bVar5 << 0x10 | (uint)bVar4 << 8) ^ bVar1 ^ uVar14;
  output[4] = (uchar)(bVar1 ^ uVar14);
  output[5] = (uchar)(uVar22 >> 8);
  output[6] = (uchar)(uVar22 >> 0x10);
  output[7] = (uchar)(uVar22 >> 0x18);
  uVar14 = ((uint)bVar9 << 0x18 | (uint)bVar8 << 0x10 | (uint)bVar7 << 8) ^ bVar2 ^ uVar17;
  output[8] = (uchar)(bVar2 ^ uVar17);
  output[9] = (uchar)(uVar14 >> 8);
  output[10] = (uchar)(uVar14 >> 0x10);
  output[0xb] = (uchar)(uVar14 >> 0x18);
  uVar14 = ((uint)bVar12 << 0x18 | (uint)bVar11 << 0x10 | (uint)bVar10 << 8) ^ bVar3 ^ uVar18;
  output[0xc] = (uchar)(bVar3 ^ uVar18);
  output[0xd] = (uchar)(uVar14 >> 8);
  output[0xe] = (uchar)(uVar14 >> 0x10);
  output[0xf] = (uchar)(uVar14 >> 0x18);
  return;
}

Assistant:

void mbedtls_aes_decrypt( mbedtls_aes_context *ctx,
                          const unsigned char input[16],
                          unsigned char output[16] )
{
    int i;
    uint32_t *RK, X0, X1, X2, X3, Y0, Y1, Y2, Y3;

    RK = ctx->rk;

    GET_UINT32_LE( X0, input,  0 ); X0 ^= *RK++;
    GET_UINT32_LE( X1, input,  4 ); X1 ^= *RK++;
    GET_UINT32_LE( X2, input,  8 ); X2 ^= *RK++;
    GET_UINT32_LE( X3, input, 12 ); X3 ^= *RK++;

    for( i = ( ctx->nr >> 1 ) - 1; i > 0; i-- )
    {
        AES_RROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );
        AES_RROUND( X0, X1, X2, X3, Y0, Y1, Y2, Y3 );
    }

    AES_RROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );

    X0 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y0       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y3 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y2 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y1 >> 24 ) & 0xFF ] << 24 );

    X1 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y1       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y0 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y3 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y2 >> 24 ) & 0xFF ] << 24 );

    X2 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y2       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y1 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y0 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y3 >> 24 ) & 0xFF ] << 24 );

    X3 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y3       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y2 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y1 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y0 >> 24 ) & 0xFF ] << 24 );

    PUT_UINT32_LE( X0, output,  0 );
    PUT_UINT32_LE( X1, output,  4 );
    PUT_UINT32_LE( X2, output,  8 );
    PUT_UINT32_LE( X3, output, 12 );
}